

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# probe.c
# Opt level: O0

float getRadius(int at,int useCOScale)

{
  undefined4 local_18;
  undefined4 local_14;
  float sf;
  float rad;
  int useCOScale_local;
  int at_local;
  
  local_18 = RadScaleFactor;
  if (useCOScale != 0) {
    local_18 = CORadScale * RadScaleFactor;
  }
  if (ImplicitH == 0) {
    local_14 = getExplRad(at);
  }
  else {
    local_14 = getImplRad(at);
  }
  return local_14 * local_18 + RadScaleOffset;
}

Assistant:

float getRadius(int at, int useCOScale)
{
   float rad = 0.0, sf = RadScaleFactor;

   if (useCOScale){ sf *= CORadScale; }

   if (ImplicitH) { rad = getImplRad(at); }
   else           { rad = getExplRad(at); }

   return (rad*sf) + RadScaleOffset;
}